

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u_init.c
# Opt level: O3

void ini_inv(trobj *trop,short *nocreate)

{
  ushort uVar1;
  objclass *poVar2;
  schar sVar3;
  byte bVar4;
  short sVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  byte *pbVar9;
  obj *poVar10;
  char *pcVar11;
  char cVar12;
  long lVar13;
  short sVar14;
  uint booktype;
  obj *in_stack_ffffffffffffffb8;
  ulong local_38;
  
  pbVar9 = &trop->field_0x4;
LAB_0027d41d:
  local_38 = (ulong)(*pbVar9 & 0x3f);
LAB_0027d425:
  cVar12 = trop->trclass;
  if (cVar12 == '\0') {
    return;
  }
  sVar5 = trop->trotyp;
  if (sVar5 == 0) {
    do {
      poVar10 = mkobj(level,cVar12,'\0');
      uVar1 = poVar10->otyp;
      booktype = (uint)(short)uVar1;
      if (((((booktype != 0x1c2) && (uVar1 != *nocreate)) && (uVar1 != nocreate[1])) &&
          ((uVar1 != nocreate[2] && (uVar1 != nocreate[3])))) &&
         (uVar1 != 0xaa || flags.elbereth_enabled == '\0')) {
        if (uVar1 < 0x141) {
          if ((1 < uVar1 - 0xab) && (uVar1 != 0x134)) goto LAB_0027d557;
        }
        else if (((0x3b < uVar1 - 0x141) ||
                 ((0x800000300000001U >> ((ulong)(uVar1 - 0x141) & 0x3f) & 1) == 0)) &&
                ((uVar1 != 0x1bc && (uVar1 != 0x1c3)))) {
LAB_0027d557:
          if ((urole.malenum != 0x160 || uVar1 != 0x157) &&
             (urole.malenum != 0x168 || uVar1 != 0x187)) {
            if (poVar10->oclass != '\n') goto LAB_0027d60f;
            if (objects[(int)booktype].oc_oc2 < '\x04') {
              iVar6 = spell_skilltype(booktype);
              pcVar11 = *(char **)&shtypes[6].iprobs[(long)urole.malenum + 0x10].itype;
              cVar12 = *pcVar11;
              while (cVar12 != '\0') {
                pcVar11 = pcVar11 + 2;
                if (iVar6 == cVar12) goto LAB_0027d60f;
                cVar12 = *pcVar11;
              }
            }
          }
        }
      }
      dealloc_obj(poVar10);
      cVar12 = trop->trclass;
    } while( true );
  }
  if (urace.malenum != 0x10b) {
    sVar14 = 0x111;
    lVar13 = 6;
    do {
      if ((sVar14 == urace.malenum) && (sVar5 == *(short *)(&Money[1].field_0x4 + lVar13))) {
        sVar5 = *(short *)(&Money[1].field_0x6 + lVar13);
        break;
      }
      sVar14 = *(short *)((long)&inv_subs[0].race_pm + lVar13);
      lVar13 = lVar13 + 6;
    } while (lVar13 != 0x96);
  }
  booktype = (uint)sVar5;
  poVar10 = mksobj(level,booktype,'\x01','\0');
  goto LAB_0027d6e7;
LAB_0027d60f:
  if (((objects[(int)booktype].field_0x10 & 0x20) != 0) && (poVar10->spe < '\x01')) {
    iVar6 = 1;
    do {
      uVar8 = mt_random();
      if (1 < uVar8 % 5) {
        sVar3 = (schar)iVar6;
        goto LAB_0027d68b;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 != 10);
    sVar3 = '\n';
LAB_0027d68b:
    poVar10->spe = sVar3;
  }
  if (uVar1 < 0x13a) {
    if (uVar1 == 0xb7) {
LAB_0027d6c6:
      *nocreate = 0xb8;
    }
    else if (uVar1 == 0xb8) {
      nocreate[0] = 0xb7;
      nocreate[1] = 0x19e;
      nocreate[2] = 0x13a;
    }
  }
  else if ((uVar1 == 0x1c9) || (uVar1 == 0x13a)) goto LAB_0027d6c6;
  if ((poVar10->oclass == '\n') || (poVar10->oclass == '\x04')) {
    nocreate[3] = uVar1;
  }
LAB_0027d6e7:
  if (trop->trclass == '\f') {
    poVar10->quan = u.umoney0;
  }
  else {
    uVar8 = *(uint *)&poVar10->field_0x4a;
    uVar7 = uVar8 | 0xe0;
    *(uint *)&poVar10->field_0x4a = uVar7;
    uVar8 = uVar8 | 0xf0;
    if ((objects[(int)booktype].field_0x10 & 4) == 0) {
      uVar8 = uVar7;
    }
    uVar7 = uVar8 & 0xfffffffe;
    *(uint *)&poVar10->field_0x4a = uVar7;
    if (poVar10->oprops != 0) {
      poVar10->oprops = 0;
    }
    if (((short)uVar8 < 0) && (u.ualign.type != -1)) {
      uVar7 = uVar8 & 0xffff7ffe;
      *(uint *)&poVar10->field_0x4a = uVar7;
    }
    cVar12 = poVar10->oclass;
    if (cVar12 == '\x02') {
LAB_0027d78f:
      iVar6 = (int)local_38;
      local_38 = 1;
LAB_0027d79e:
      poVar10->quan = iVar6;
    }
    else if (cVar12 == '\r') {
      iVar6 = 1;
      if (0xfffc < (ushort)(poVar10->otyp - 0x212U)) goto LAB_0027d79e;
    }
    else if (cVar12 == '\x06') goto LAB_0027d78f;
    if (poVar10->otyp == 0x7a) {
      uVar7 = uVar7 | 1;
      *(uint *)&poVar10->field_0x4a = uVar7;
    }
    if (trop->trspe != '\x7f') {
      poVar10->spe = trop->trspe;
    }
    uVar8 = (uint)((byte)trop->field_0x4 >> 6);
    if (uVar8 != 2) {
      *(uint *)&poVar10->field_0x4a = (uVar7 & 0xfffffffd) + (uVar8 & 1) * 2;
    }
  }
  uVar8 = weight(poVar10);
  poVar10->owt = uVar8;
  poVar10 = addinv(in_stack_ffffffffffffffb8);
  if ((obj_descr[objects[(int)booktype].oc_descr_idx].oc_descr != (char *)0x0) &&
     ((poVar10->field_0x4a & 0x10) != 0)) {
    discover_object(booktype,'\x01','\0');
    objects[(int)booktype].field_0x10 = objects[(int)booktype].field_0x10 | 8;
  }
  discover_object(0x142,'\x01','\0');
  poVar2 = objects;
  objects[0x142].field_0x10 = objects[0x142].field_0x10 | 8;
  bVar4 = poVar10->oclass;
  if ((bVar4 == 3) && (u.roleplay.nudist == '\0')) {
    cVar12 = poVar2[poVar10->otyp].oc_subtyp;
    if ((cVar12 == '\x01') && (uarms == (obj *)0x0)) {
      setworn(poVar10,8);
      if (uswapwep != (obj *)0x0) {
        setuswapwep((obj *)0x0);
      }
    }
    else {
      if ((cVar12 == '\x02') && (uarmh == (obj *)0x0)) {
        lVar13 = 4;
      }
      else if ((cVar12 == '\x03') && (uarmg == (obj *)0x0)) {
        lVar13 = 0x10;
      }
      else if ((cVar12 == '\x06') && (uarmu == (obj *)0x0)) {
        lVar13 = 0x40;
      }
      else if ((cVar12 == '\x05') && (uarmc == (obj *)0x0)) {
        lVar13 = 2;
      }
      else if ((cVar12 == '\x04') && (uarmf == (obj *)0x0)) {
        lVar13 = 0x20;
      }
      else {
        if ((cVar12 != '\0') || (uarm != (obj *)0x0)) goto LAB_0027d981;
        lVar13 = 1;
      }
      setworn(poVar10,lVar13);
    }
LAB_0027d981:
    bVar4 = poVar10->oclass;
  }
  if (bVar4 == 2) {
LAB_0027d9ff:
    cVar12 = objects[poVar10->otyp].oc_subtyp;
    if ((byte)(cVar12 + 0x18U) < 3) {
LAB_0027da29:
      if (uquiver == (obj *)0x0) {
        setuqwep(poVar10);
      }
      goto LAB_0027da91;
    }
    if ((bVar4 | 4) == 6) goto LAB_0027da21;
  }
  else if (bVar4 == 6) {
    cVar12 = objects[poVar10->otyp].oc_subtyp;
    if ((booktype != 0xf4) && (cVar12 == '\0')) {
      if ((booktype & 0xfffffffe) != 0x212) goto LAB_0027da91;
      cVar12 = objects[poVar10->otyp].oc_subtyp;
    }
LAB_0027da21:
    if (((byte)(cVar12 + 0x1bU) < 3) || ((bVar4 == 2 && (1 < poVar10->quan)))) goto LAB_0027da29;
  }
  else {
    if ((1 < booktype - 0x212) && (booktype != 0xf4)) goto LAB_0027da91;
    if ((bVar4 == 2) || (bVar4 == 0xd)) goto LAB_0027d9ff;
  }
  if ((uwep == (obj *)0x0) && (u.roleplay.pacifist == '\0')) {
    setuwep(poVar10);
  }
  else if (uswapwep == (obj *)0x0) {
    setuswapwep(poVar10);
  }
LAB_0027da91:
  if ((poVar10->oclass == '\n') && (poVar10->otyp != 0x1bc)) {
    initialspell(poVar10);
  }
  if ((poVar10->otyp == 0xee) && (u.roleplay.blindfolded != '\0')) {
    setworn(poVar10,0x80000);
  }
  local_38 = local_38 - 1;
  if (local_38 == 0) goto LAB_0027db09;
  goto LAB_0027d425;
LAB_0027db09:
  pbVar9 = &trop[1].field_0x4;
  trop = trop + 1;
  goto LAB_0027d41d;
}

Assistant:

static void ini_inv(const struct trobj *trop, short nocreate[4])
{
	struct obj *obj;
	int otyp, i;
	long trquan = trop->trquan;

	while (trop->trclass) {
		if (trop->trotyp != UNDEF_TYP) {
			otyp = (int)trop->trotyp;
			if (urace.malenum != PM_HUMAN) {
			    /* substitute specific items for generic ones */
			    for (i = 0; inv_subs[i].race_pm != NON_PM; ++i)
				if (inv_subs[i].race_pm == urace.malenum &&
					otyp == inv_subs[i].item_otyp) {
				    otyp = inv_subs[i].subs_otyp;
				    break;
				}
			}
			obj = mksobj(level, otyp, TRUE, FALSE);
		} else {	/* UNDEF_TYP */
		/*
		 * For random objects, do not create certain overly powerful
		 * items: wand of wishing, ring of levitation, or the
		 * polymorph/polymorph control combination.  Specific objects,
		 * i.e. the discovery wishing, are still OK.
		 * Also, don't get a couple of really useless items.  (Note:
		 * punishment isn't "useless".  Some players who start out with
		 * one will immediately read it and use the iron ball as a
		 * weapon.)
		 */
			obj = mkobj(level, trop->trclass, FALSE);
			otyp = obj->otyp;
			while (otyp == WAN_WISHING
				|| otyp == nocreate[0]
				|| otyp == nocreate[1]
				|| otyp == nocreate[2]
				|| otyp == nocreate[3]
				|| (otyp == RIN_LEVITATION && flags.elbereth_enabled)
				/* 'useless' items */
				|| otyp == POT_HALLUCINATION
				|| otyp == POT_ACID
				|| otyp == SCR_FLOOD
				|| otyp == SCR_FIRE
				|| otyp == SCR_BLANK_PAPER
				|| otyp == SPE_BLANK_PAPER
				|| otyp == RIN_AGGRAVATE_MONSTER
				|| otyp == RIN_HUNGER
				|| otyp == WAN_NOTHING
				/* Monks don't use weapons */
				|| (otyp == SCR_ENCHANT_WEAPON &&
				    Role_if (PM_MONK))
				/* wizard patch -- they already have one */
				|| (otyp == SPE_FORCE_BOLT &&
				    Role_if (PM_WIZARD))
				/* powerful spells are either useless to
				   low level players or unbalancing; also
				   spells in restricted skill categories */
				|| (obj->oclass == SPBOOK_CLASS &&
				    (objects[otyp].oc_level > 3 ||
				    restricted_spell_discipline(otyp)))
							) {
				dealloc_obj(obj);
				obj = mkobj(level, trop->trclass, FALSE);
				otyp = obj->otyp;
			}

			/* Don't start with +0 or negative rings */
			if (objects[otyp].oc_charged && obj->spe <= 0)
				obj->spe = rne(3);

			/* Heavily relies on the fact that 1) we create wands
			 * before rings, 2) that we create rings before
			 * spellbooks, and that 3) not more than 1 object of a
			 * particular symbol is to be prohibited.  (For more
			 * objects, we need more nocreate variables...)
			 */
			switch (otyp) {
			    case WAN_POLYMORPH:
			    case RIN_POLYMORPH:
			    case POT_POLYMORPH:
				nocreate[0] = RIN_POLYMORPH_CONTROL;
				break;
			    case RIN_POLYMORPH_CONTROL:
				nocreate[0] = RIN_POLYMORPH;
				nocreate[1] = SPE_POLYMORPH;
				nocreate[2] = POT_POLYMORPH;
			}
			/* Don't have 2 of the same ring or spellbook */
			if (obj->oclass == RING_CLASS ||
			    obj->oclass == SPBOOK_CLASS)
				nocreate[3] = otyp;
		}

		if (trop->trclass == COIN_CLASS) {
			/* no "blessed" or "identified" money */
			obj->quan = u.umoney0;
		} else {
			obj->dknown = obj->bknown = obj->rknown = 1;
			if (objects[otyp].oc_uses_known) obj->known = 1;
			obj->cursed = 0;
			if (obj->oprops) obj->oprops = 0L;
			if (obj->opoisoned && u.ualign.type != A_CHAOTIC)
			    obj->opoisoned = 0;
			if (obj->oclass == WEAPON_CLASS ||
				obj->oclass == TOOL_CLASS) {
			    obj->quan = trquan;
			    trquan = 1;
			} else if (obj->oclass == GEM_CLASS &&
				is_graystone(obj) && obj->otyp != FLINT) {
			    obj->quan = 1L;
			}
			if (obj->otyp == STRIPED_SHIRT)
			    obj->cursed = TRUE;
			if (trop->trspe != UNDEF_SPE)
			    obj->spe = trop->trspe;
			if (trop->trbless != UNDEF_BLESS)
			    obj->blessed = trop->trbless;
		}
		/* defined after setting otyp+quan + blessedness */
		obj->owt = weight(obj);
		obj = addinv(obj);

		/* Make the type known if necessary */
		if (OBJ_DESCR(objects[otyp]) && obj->known)
			knows_object(otyp);

		/* pre-ID oil as it's easy to check anyway */
		knows_object(POT_OIL);

		if (obj->oclass == ARMOR_CLASS && !u.roleplay.nudist) {
			if (is_shield(obj) && !uarms) {
				setworn(obj, W_ARMS);
				if (uswapwep) setuswapwep(NULL);
			} else if (is_helmet(obj) && !uarmh)
				setworn(obj, W_ARMH);
			else if (is_gloves(obj) && !uarmg)
				setworn(obj, W_ARMG);
			else if (is_shirt(obj) && !uarmu)
				setworn(obj, W_ARMU);
			else if (is_cloak(obj) && !uarmc)
				setworn(obj, W_ARMC);
			else if (is_boots(obj) && !uarmf)
				setworn(obj, W_ARMF);
			else if (is_suit(obj) && !uarm)
				setworn(obj, W_ARM);
		}

		if (obj->oclass == WEAPON_CLASS || is_weptool(obj) ||
			otyp == TIN_OPENER || otyp == FLINT || otyp == ROCK) {
		    if (is_ammo(obj) || is_missile(obj) ||
			/* starting weapon stacks are usually for throwing */
			(obj->oclass == WEAPON_CLASS && obj->quan > 1)) {
			if (!uquiver) setuqwep(obj);
		    } else if (!uwep && !u.roleplay.pacifist) setuwep(obj);
		    else if (!uswapwep) setuswapwep(obj);
		}
		if (obj->oclass == SPBOOK_CLASS &&
				obj->otyp != SPE_BLANK_PAPER)
		    initialspell(obj);

		if (obj->otyp == BLINDFOLD && u.roleplay.blindfolded)
		    setworn(obj, W_TOOL);

		if (--trquan) continue;	/* make a similar object */
		trop++;
		trquan = trop->trquan;
	}
}